

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qcommandlinkbutton.cpp
# Opt level: O0

void QCommandLinkButton::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  QObject QVar2;
  undefined8 *in_RCX;
  int in_EDX;
  int in_ESI;
  QPushButton *in_RDI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QCommandLinkButton *_t;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar3;
  QPushButton *in_stack_ffffffffffffffb0;
  QCommandLinkButton *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 1) {
    in_stack_ffffffffffffffb8 = (QCommandLinkButton *)*in_RCX;
    if (in_EDX == 0) {
      iVar3 = in_EDX;
      description(in_stack_ffffffffffffffb8);
      QString::operator=((QString *)in_stack_ffffffffffffffb0,
                         (QString *)CONCAT44(iVar3,in_stack_ffffffffffffffa8));
      QString::~QString((QString *)0x556e37);
    }
    else if (in_EDX == 1) {
      QVar2 = (QObject)QPushButton::isFlat(in_stack_ffffffffffffffb0);
      (in_stack_ffffffffffffffb8->super_QPushButton).super_QAbstractButton.super_QWidget.
      super_QObject = QVar2;
    }
  }
  if (in_ESI == 2) {
    if (in_EDX == 0) {
      setDescription((QCommandLinkButton *)in_RDI,(QString *)in_stack_ffffffffffffffb8);
    }
    else if (in_EDX == 1) {
      QPushButton::setFlat(in_RDI,SUB81((ulong)in_stack_ffffffffffffffb8 >> 0x38,0));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCommandLinkButton::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QCommandLinkButton *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->description(); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->isFlat(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setDescription(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setFlat(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}